

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O0

void my_canvas_draw_new(t_my_canvas *x,_glist *glist)

{
  _glist *p_Var1;
  undefined8 in_stack_fffffffffffffe90;
  uint uVar3;
  ulong uVar2;
  undefined8 in_stack_fffffffffffffe98;
  uint uVar5;
  ulong uVar4;
  char *local_148;
  char *tags [4];
  char tag [128];
  char tag_object [128];
  _glist *canvas;
  _glist *glist_local;
  t_my_canvas *x_local;
  
  uVar5 = (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  uVar3 = (uint)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  p_Var1 = glist_getcanvas(glist);
  local_148 = tag + 0x78;
  tags[0] = (char *)(tags + 3);
  tags[1] = "label";
  tags[2] = "text";
  sprintf(tag + 0x78,"%lxOBJ",x);
  sprintf((char *)(tags + 3),"%lxRECT",x);
  uVar2 = (ulong)uVar3 << 0x20;
  uVar4 = (ulong)uVar5 << 0x20;
  pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","rectangle",0,0,uVar2,uVar4,"-tags",2,
              &local_148);
  sprintf((char *)(tags + 3),"%lxBASE",x);
  pdgui_vmess((char *)0x0,"crr iiii rS",p_Var1,"create","rectangle",0,0,uVar2 & 0xffffffff00000000,
              uVar4 & 0xffffffff00000000,"-tags",2,&local_148);
  sprintf((char *)(tags + 3),"%lxLABEL",x);
  pdgui_vmess((char *)0x0,"crr ii rs rS",p_Var1,"create","text",0,0,"-anchor","w","-tags",4,
              &local_148);
  my_canvas_draw_config(x,glist);
  return;
}

Assistant:

static void my_canvas_draw_new(t_my_canvas *x, t_glist *glist)
{
    t_canvas *canvas = glist_getcanvas(glist);
    char tag_object[128], tag[128];
    char *tags[] = {tag_object, tag, "label", "text"};
    sprintf(tag_object, "%lxOBJ", x);

    sprintf(tag, "%lxRECT", x);
    pdgui_vmess(0, "crr iiii rS", canvas, "create", "rectangle",
        0, 0, 0, 0, "-tags", 2, tags);

    sprintf(tag, "%lxBASE", x);
    pdgui_vmess(0, "crr iiii rS", canvas, "create", "rectangle",
        0, 0, 0, 0, "-tags", 2, tags);

    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crr ii rs rS", canvas, "create", "text",
        0, 0, "-anchor", "w", "-tags", 4, tags);

    my_canvas_draw_config(x, glist);
}